

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O3

void test16(char *infile,char *password,char *outfile,char *xarg)

{
  char *pcVar1;
  char *pcVar2;
  FILE *__s;
  size_t __n;
  void *__ptr;
  
  qpdf_read(qpdf,infile,password);
  pcVar1 = (char *)qpdf_get_info_key(qpdf,"/Author");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "(null)";
  }
  printf("Info key %s: %s\n","/Author",pcVar1);
  pcVar1 = (char *)qpdf_get_info_key(qpdf,"/Producer");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "(null)";
  }
  printf("Info key %s: %s\n","/Producer",pcVar1);
  pcVar1 = (char *)qpdf_get_info_key(qpdf,"/Creator");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "(null)";
  }
  printf("Info key %s: %s\n","/Creator",pcVar1);
  qpdf_set_info_key(qpdf,"/Author","Mr. Potato Head");
  qpdf_set_info_key(qpdf,"/Producer","QPDF library");
  qpdf_set_info_key(qpdf,"/Creator",0);
  pcVar1 = (char *)qpdf_get_info_key(qpdf,"/Author");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "(null)";
  }
  printf("Info key %s: %s\n","/Author",pcVar1);
  pcVar1 = (char *)qpdf_get_info_key(qpdf,"/Producer");
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "(null)";
  }
  printf("Info key %s: %s\n","/Producer",pcVar1);
  pcVar2 = (char *)qpdf_get_info_key(qpdf,"/Creator");
  pcVar1 = "(null)";
  if (pcVar2 != (char *)0x0) {
    pcVar1 = pcVar2;
  }
  printf("Info key %s: %s\n","/Creator",pcVar1);
  qpdf_init_write_memory(qpdf);
  qpdf_set_static_ID(qpdf,1);
  qpdf_set_static_aes_IV(qpdf,1);
  qpdf_set_stream_data_mode(qpdf,0);
  qpdf_write(qpdf);
  __s = (FILE *)safe_fopen(outfile,"wb");
  __n = qpdf_get_buffer_length(qpdf);
  __ptr = (void *)qpdf_get_buffer(qpdf);
  fwrite(__ptr,1,__n,__s);
  fclose(__s);
  report_errors();
  return;
}

Assistant:

static void
test16(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    unsigned long buflen = 0L;
    unsigned char const* buf = 0;
    FILE* f = 0;

    qpdf_read(qpdf, infile, password);
    print_info("/Author");
    print_info("/Producer");
    print_info("/Creator");
    qpdf_set_info_key(qpdf, "/Author", "Mr. Potato Head");
    qpdf_set_info_key(qpdf, "/Producer", "QPDF library");
    qpdf_set_info_key(qpdf, "/Creator", 0);
    print_info("/Author");
    print_info("/Producer");
    print_info("/Creator");
    qpdf_init_write_memory(qpdf);
    qpdf_set_static_ID(qpdf, QPDF_TRUE);
    qpdf_set_static_aes_IV(qpdf, QPDF_TRUE);
    qpdf_set_stream_data_mode(qpdf, qpdf_s_uncompress);
    qpdf_write(qpdf);
    f = safe_fopen(outfile, "wb");
    buflen = (unsigned long)(qpdf_get_buffer_length(qpdf));
    buf = qpdf_get_buffer(qpdf);
    fwrite(buf, 1, buflen, f);
    fclose(f);
    report_errors();
}